

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

gdImagePtr gdImageCreateFromGif(FILE *fdFile)

{
  gdIOCtx *fd;
  gdImagePtr pgVar1;
  
  fd = gdNewFileCtx(fdFile);
  if (fd == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromGifCtx(fd);
    (*fd->gd_free)(fd);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGif(FILE *fdFile)
{
	gdIOCtx *fd = gdNewFileCtx(fdFile);
	gdImagePtr im;

	if (fd == NULL) return NULL;
	im = gdImageCreateFromGifCtx(fd);

	fd->gd_free(fd);

	return im;
}